

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O2

void bn_mul_part_recursive
               (unsigned_long *r,unsigned_long *a,unsigned_long *b,int n,int tna,int tnb,
               unsigned_long *t)

{
  unsigned_long *a_00;
  ulong *puVar1;
  unsigned_long uVar2;
  uint num;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  unsigned_long *puVar10;
  unsigned_long *puVar11;
  uint uVar12;
  int dl;
  int iVar13;
  
  if (n < 8) {
    bn_mul_normal(r,a,tna + n,b,tnb + n);
    return;
  }
  puVar9 = a + (uint)n;
  dl = n - tna;
  iVar4 = bn_cmp_part_words(a,puVar9,tna,dl);
  a_00 = b + (uint)n;
  iVar13 = tnb - n;
  iVar5 = bn_cmp_part_words(a_00,b,tnb,iVar13);
  switch(iVar5 + iVar4 * 3) {
  case 3:
  case 4:
    bn_sub_part_words(t,a,puVar9,tna,dl);
    bn_sub_part_words(t + (uint)n,a_00,b,tnb,iVar13);
  default:
    bVar3 = true;
    break;
  case -4:
    bVar3 = true;
    bn_sub_part_words(t,puVar9,a,tna,tna - n);
    bn_sub_part_words(t + (uint)n,b,a_00,tnb,n - tnb);
    break;
  case -3:
  case -2:
    bn_sub_part_words(t,puVar9,a,tna,tna - n);
    puVar10 = b;
    puVar11 = a_00;
    goto LAB_00113916;
  case -1:
  case 0:
  case 1:
  case 2:
    bn_sub_part_words(t,a,puVar9,tna,dl);
    iVar13 = n - tnb;
    puVar10 = a_00;
    puVar11 = b;
LAB_00113916:
    bn_sub_part_words(t + (uint)n,puVar11,puVar10,tnb,iVar13);
    bVar3 = false;
  }
  num = n * 2;
  uVar8 = (ulong)num;
  if (n == 8) {
    bn_mul_comba8(t + uVar8,t,t + (uint)n);
    bn_mul_comba8(r,a,b);
    bn_mul_normal(r + uVar8,puVar9,tna,a_00,tnb);
    memset(r + (int)(tnb + tna + num),0,(long)(0x10 - (tnb + tna)) << 3);
    uVar8 = 0x10;
  }
  else {
    puVar10 = t + (uint)(n * 4);
    bn_mul_recursive(t + uVar8,t,t + (uint)n,n,0,0,puVar10);
    bn_mul_recursive(r,a,b,n,0,0,puVar10);
    uVar6 = (uint)n >> 1;
    uVar7 = (ulong)uVar6;
    uVar12 = tnb;
    if (tnb < tna) {
      uVar12 = tna;
    }
    if (uVar12 == uVar6) {
      bn_mul_recursive(r + uVar8,puVar9,a_00,uVar6,tna - uVar6,tnb - uVar6,puVar10);
      uVar6 = n & 0x7ffffffe;
      uVar7 = (ulong)(uVar6 + num);
    }
    else {
      puVar11 = r + uVar8;
      if ((int)uVar12 <= (int)uVar6) {
        memset(puVar11,0,uVar8 * 8);
        if (tna < 0x10 && tnb < 0x10) {
          bn_mul_normal(puVar11,puVar9,tna,a_00,tnb);
        }
        else {
          do {
            uVar7 = uVar7 >> 1;
            iVar13 = (int)uVar7;
            if (iVar13 < (int)uVar12) {
              bn_mul_part_recursive(puVar11,puVar9,a_00,iVar13,tna - iVar13,tnb - iVar13,puVar10);
              goto LAB_00113c43;
            }
          } while ((tna - iVar13 != 0) && (tnb != iVar13));
          bn_mul_recursive(puVar11,puVar9,a_00,iVar13,tna - iVar13,tnb - iVar13,puVar10);
        }
        goto LAB_00113c43;
      }
      bn_mul_part_recursive(puVar11,puVar9,a_00,uVar6,tna - uVar6,tnb - uVar6,puVar10);
      uVar6 = tnb + tna;
      uVar7 = (ulong)(int)(uVar6 + num);
    }
    memset(r + uVar7,0,(long)(int)(num - uVar6) << 3);
  }
LAB_00113c43:
  uVar7 = bn_add_words(t,r,r + uVar8,num);
  puVar1 = t + uVar8;
  if (bVar3) {
    uVar8 = bn_add_words(puVar1,puVar1,t,num);
    iVar13 = (int)uVar8;
  }
  else {
    uVar8 = bn_sub_words(puVar1,t,puVar1,num);
    iVar13 = -(int)uVar8;
  }
  uVar8 = bn_add_words(r + (uint)n,r + (uint)n,puVar1,num);
  iVar13 = (int)uVar8 + iVar13 + (int)uVar7;
  if (iVar13 != 0) {
    puVar1 = r + (uint)(n * 3);
    uVar8 = *puVar1;
    *puVar1 = *puVar1 + (long)iVar13;
    if (CARRY8(uVar8,(long)iVar13)) {
      puVar9 = r + (ulong)(uint)(n * 3) + 1;
      do {
        *puVar9 = *puVar9 + 1;
        uVar2 = *puVar9;
        puVar9 = puVar9 + 1;
      } while (uVar2 == 0);
    }
  }
  return;
}

Assistant:

void bn_mul_part_recursive(BN_ULONG *r, BN_ULONG *a, BN_ULONG *b, int n,
                           int tna, int tnb, BN_ULONG *t)
{
    int i, j, n2 = n * 2;
    int c1, c2, neg;
    BN_ULONG ln, lo, *p;

    if (n < 8) {
        bn_mul_normal(r, a, n + tna, b, n + tnb);
        return;
    }

    /* r=(a[0]-a[1])*(b[1]-b[0]) */
    c1 = bn_cmp_part_words(a, &(a[n]), tna, n - tna);
    c2 = bn_cmp_part_words(&(b[n]), b, tnb, tnb - n);
    neg = 0;
    switch (c1 * 3 + c2) {
    case -4:
        bn_sub_part_words(t, &(a[n]), a, tna, tna - n); /* - */
        bn_sub_part_words(&(t[n]), b, &(b[n]), tnb, n - tnb); /* - */
        break;
    case -3:
        /* break; */
    case -2:
        bn_sub_part_words(t, &(a[n]), a, tna, tna - n); /* - */
        bn_sub_part_words(&(t[n]), &(b[n]), b, tnb, tnb - n); /* + */
        neg = 1;
        break;
    case -1:
    case 0:
    case 1:
        /* break; */
    case 2:
        bn_sub_part_words(t, a, &(a[n]), tna, n - tna); /* + */
        bn_sub_part_words(&(t[n]), b, &(b[n]), tnb, n - tnb); /* - */
        neg = 1;
        break;
    case 3:
        /* break; */
    case 4:
        bn_sub_part_words(t, a, &(a[n]), tna, n - tna);
        bn_sub_part_words(&(t[n]), &(b[n]), b, tnb, tnb - n);
        break;
    }
    /*
     * The zero case isn't yet implemented here. The speedup would probably
     * be negligible.
     */
# if 0
    if (n == 4) {
        bn_mul_comba4(&(t[n2]), t, &(t[n]));
        bn_mul_comba4(r, a, b);
        bn_mul_normal(&(r[n2]), &(a[n]), tn, &(b[n]), tn);
        memset(&r[n2 + tn * 2], 0, sizeof(*r) * (n2 - tn * 2));
    } else
# endif
    if (n == 8) {
        bn_mul_comba8(&(t[n2]), t, &(t[n]));
        bn_mul_comba8(r, a, b);
        bn_mul_normal(&(r[n2]), &(a[n]), tna, &(b[n]), tnb);
        memset(&r[n2 + tna + tnb], 0, sizeof(*r) * (n2 - tna - tnb));
    } else {
        p = &(t[n2 * 2]);
        bn_mul_recursive(&(t[n2]), t, &(t[n]), n, 0, 0, p);
        bn_mul_recursive(r, a, b, n, 0, 0, p);
        i = n / 2;
        /*
         * If there is only a bottom half to the number, just do it
         */
        if (tna > tnb)
            j = tna - i;
        else
            j = tnb - i;
        if (j == 0) {
            bn_mul_recursive(&(r[n2]), &(a[n]), &(b[n]),
                             i, tna - i, tnb - i, p);
            memset(&r[n2 + i * 2], 0, sizeof(*r) * (n2 - i * 2));
        } else if (j > 0) {     /* eg, n == 16, i == 8 and tn == 11 */
            bn_mul_part_recursive(&(r[n2]), &(a[n]), &(b[n]),
                                  i, tna - i, tnb - i, p);
            memset(&(r[n2 + tna + tnb]), 0,
                   sizeof(BN_ULONG) * (n2 - tna - tnb));
        } else {                /* (j < 0) eg, n == 16, i == 8 and tn == 5 */

            memset(&r[n2], 0, sizeof(*r) * n2);
            if (tna < BN_MUL_RECURSIVE_SIZE_NORMAL
                && tnb < BN_MUL_RECURSIVE_SIZE_NORMAL) {
                bn_mul_normal(&(r[n2]), &(a[n]), tna, &(b[n]), tnb);
            } else {
                for (;;) {
                    i /= 2;
                    /*
                     * these simplified conditions work exclusively because
                     * difference between tna and tnb is 1 or 0
                     */
                    if (i < tna || i < tnb) {
                        bn_mul_part_recursive(&(r[n2]),
                                              &(a[n]), &(b[n]),
                                              i, tna - i, tnb - i, p);
                        break;
                    } else if (i == tna || i == tnb) {
                        bn_mul_recursive(&(r[n2]),
                                         &(a[n]), &(b[n]),
                                         i, tna - i, tnb - i, p);
                        break;
                    }
                }
            }
        }
    }

    /*-
     * t[32] holds (a[0]-a[1])*(b[1]-b[0]), c1 is the sign
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     */

    c1 = (int)(bn_add_words(t, r, &(r[n2]), n2));

    if (neg) {                  /* if t[32] is negative */
        c1 -= (int)(bn_sub_words(&(t[n2]), t, &(t[n2]), n2));
    } else {
        /* Might have a carry */
        c1 += (int)(bn_add_words(&(t[n2]), &(t[n2]), t, n2));
    }

    /*-
     * t[32] holds (a[0]-a[1])*(b[1]-b[0])+(a[0]*b[0])+(a[1]*b[1])
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     * c1 holds the carry bits
     */
    c1 += (int)(bn_add_words(&(r[n]), &(r[n]), &(t[n2]), n2));
    if (c1) {
        p = &(r[n + n2]);
        lo = *p;
        ln = (lo + c1) & BN_MASK2;
        *p = ln;

        /*
         * The overflow will stop before we over write words we should not
         * overwrite
         */
        if (ln < (BN_ULONG)c1) {
            do {
                p++;
                lo = *p;
                ln = (lo + 1) & BN_MASK2;
                *p = ln;
            } while (ln == 0);
        }
    }
}